

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

int ply_get_argument_property
              (p_ply_argument argument,p_ply_property_conflict *property,long *length,
              long *value_index)

{
  long *value_index_local;
  long *length_local;
  p_ply_property_conflict *property_local;
  p_ply_argument argument_local;
  
  if (argument != (p_ply_argument)0x0) {
    if (argument == (p_ply_argument)0x0) {
      argument_local._4_4_ = 0;
    }
    else {
      if (property != (p_ply_property_conflict *)0x0) {
        *property = argument->property;
      }
      if (length != (long *)0x0) {
        *length = argument->length;
      }
      if (value_index != (long *)0x0) {
        *value_index = argument->value_index;
      }
      argument_local._4_4_ = 1;
    }
    return argument_local._4_4_;
  }
  __assert_fail("argument",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x316,
                "int ply_get_argument_property(p_ply_argument, p_ply_property *, long *, long *)");
}

Assistant:

int ply_get_argument_property(p_ply_argument argument,
        p_ply_property *property, long *length, long *value_index) {
    assert(argument);
    if (!argument) return 0;
    if (property) *property = argument->property;
    if (length) *length = argument->length;
    if (value_index) *value_index = argument->value_index;
    return 1;
}